

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O1

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::AddInternal(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
              *this,void *key,PinRecord data,uint targetBucket)

{
  EntryType **ppEVar1;
  uint uVar2;
  EntryType *pEVar3;
  EntryType *pEVar4;
  
  if ((this->disableResize == false) && (this->size * 6 < this->count)) {
    uVar2 = PrimePolicy::GetPrime(this->size * 2,&this->modFunctionIndex);
    Resize(this,uVar2);
    targetBucket = PrimePolicy::ModPrime
                             ((hash_t)((ulong)key >> 4),this->size,this->modFunctionIndex);
  }
  pEVar3 = GetFreeEntry(this);
  pEVar3->key = key;
  (pEVar3->value).stackBackTraces = data.stackBackTraces;
  (pEVar3->value).refCount = data.refCount;
  ppEVar1 = this->table;
  pEVar3->next = ppEVar1[targetBucket];
  ppEVar1[targetBucket] = pEVar3;
  this->count = this->count + 1;
  uVar2 = 0;
  for (pEVar4 = this->table[targetBucket]; pEVar4 != (EntryType *)0x0; pEVar4 = pEVar4->next) {
    uVar2 = uVar2 + 1;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,uVar2);
  }
  return pEVar3;
}

Assistant:

EntryType* AddInternal(TKey key, TData data, uint targetBucket)
    {
        if(resize && !disableResize && IsDenserThan<MaxAverageChainLength>())
        {
            Resize(SizePolicy::GetSize(size*2, &modFunctionIndex));
            // After resize - we will need to recalculate the bucket
            targetBucket = HashKeyToBucket(key);
        }

        EntryType* entry = GetFreeEntry();
        entry->key = key;
        entry->value = data;
        entry->next = table[targetBucket];
        table[targetBucket] = entry;
        count++;

#if PROFILE_DICTIONARY
        uint depth = 0;
        for (EntryType * current = table[targetBucket] ; current != nullptr; current = current->next)
        {
            ++depth;
        }
        if (stats)
            stats->Insert(depth);
#endif
        return entry;
    }